

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::detail::
     stringPrintfRecursive<float_const&,pbrt::Normal3<float>const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::BSSRDFTable_const&>
               (string *s,char *fmt,float *v,Normal3<float> *args,SampledSpectrum *args_1,
               SampledSpectrum *args_2,BSSRDFTable *args_3)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Normal3<float> *v_00;
  char *s_00;
  int line;
  detail *this;
  char cVar5;
  string nextFmt;
  char *fmt_local;
  undefined8 local_200 [4];
  undefined8 local_1e0;
  enable_if_t<_std::is_class<typename_std::decay_t<const_char_*>_>::value,_std::string> local_1d8;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  v_00 = args;
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar5 = (char)&nextFmt;
  lVar2 = std::__cxx11::string::find(cVar5,0x2a);
  lVar3 = std::__cxx11::string::find(cVar5,0x73);
  lVar4 = std::__cxx11::string::find(cVar5,100);
  if (lVar2 != -1) {
    s_00 = "Non-integral type provided for %* format.";
    line = 0xe8;
    goto LAB_00347f3a;
  }
  this = (detail *)0x2c7217a;
  bVar1 = std::operator==(&nextFmt,"%f");
  if (bVar1) {
LAB_00347df7:
    FloatToString_abi_cxx11_((string *)&ss,this,*v);
    std::__cxx11::string::append((string *)s);
  }
  else {
    this = (detail *)0x2c760fd;
    bVar1 = std::operator==(&nextFmt,"%s");
    if (bVar1) goto LAB_00347df7;
    if (lVar4 != -1) {
      s_00 = "Non-integral type passed to %d format.";
      line = 0x104;
LAB_00347f3a:
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
               ,line,s_00);
    }
    if (lVar3 != -1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,*v);
      std::__cxx11::stringbuf::str();
      local_1e0 = local_200[0];
      formatOne<char_const*>
                (&local_1d8,(detail *)nextFmt._M_dataplus._M_p,(char *)&local_1e0,(char **)v_00);
      std::__cxx11::string::append((string *)s);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      goto LAB_00347e27;
    }
    if (nextFmt._M_string_length == 0) {
      s_00 = "Excess values passed to Printf.";
      line = 0x10d;
      goto LAB_00347f3a;
    }
    formatOne<float_const&>
              ((enable_if_t<_std::is_class<typename_std::decay_t<const_float_&>_>::value,_std::string>
                *)&ss,(detail *)nextFmt._M_dataplus._M_p,(char *)v,(float *)v_00);
    std::__cxx11::string::append((string *)s);
  }
  std::__cxx11::string::~string((string *)&ss);
LAB_00347e27:
  stringPrintfRecursive<pbrt::Normal3<float>const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::BSSRDFTable_const&>
            (s,fmt_local,args,args_1,args_2,args_3);
  std::__cxx11::string::~string((string *)&nextFmt);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}